

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

connectbundle *
Curl_conncache_find_bundle(Curl_easy *data,connectdata *conn,conncache *connc,char **hostp)

{
  size_t key_len;
  connectbundle *pcVar1;
  char **hostp_00;
  char key [128];
  
  hostp_00 = hostp;
  if (data->share != (Curl_share *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
  }
  if (connc == (conncache *)0x0) {
    pcVar1 = (connectbundle *)0x0;
  }
  else {
    hashkey(conn,key,(size_t)hostp,hostp_00);
    key_len = strlen(key);
    pcVar1 = (connectbundle *)Curl_hash_pick(&connc->hash,key,key_len);
  }
  return pcVar1;
}

Assistant:

struct connectbundle *
Curl_conncache_find_bundle(struct Curl_easy *data,
                           struct connectdata *conn,
                           struct conncache *connc,
                           const char **hostp)
{
  struct connectbundle *bundle = NULL;
  CONNCACHE_LOCK(data);
  if(connc) {
    char key[HASHKEY_SIZE];
    hashkey(conn, key, sizeof(key), hostp);
    bundle = Curl_hash_pick(&connc->hash, key, strlen(key));
  }

  return bundle;
}